

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<siginfo_t> * __thiscall
kj::_::NullableValue<siginfo_t>::operator=
          (NullableValue<siginfo_t> *this,NullableValue<siginfo_t> *other)

{
  long lVar1;
  anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *paVar2;
  anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *paVar3;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
    }
    if (other->isSet == true) {
      paVar2 = &other->field_1;
      paVar3 = &this->field_1;
      for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
        *(undefined8 *)paVar3 = *(undefined8 *)paVar2;
        paVar2 = (anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *)((long)paVar2 + 8);
        paVar3 = (anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *)((long)paVar3 + 8);
      }
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }